

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellANCF_3443.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementShellANCF_3443::ComputeGravityForces
          (ChElementShellANCF_3443 *this,ChVectorDynamic<> *Fg,ChVector<double> *G_acc)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 (*pauVar4) [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  
  if ((Fg->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows == 0x30)
  {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = G_acc->m_data[0];
    auVar5 = vbroadcastsd_avx512f(auVar1);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = G_acc->m_data[1];
    auVar6 = vbroadcastsd_avx512f(auVar2);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = G_acc->m_data[2];
    auVar7 = vbroadcastsd_avx512f(auVar3);
    auVar10 = *(undefined1 (*) [64])
               (this->m_GravForceScale).
               super_PlainObjectBase<Eigen::Matrix<double,_16,_1,_0,_16,_1>_>.m_storage.m_data.array
    ;
    auVar11 = *(undefined1 (*) [64])
               ((this->m_GravForceScale).
                super_PlainObjectBase<Eigen::Matrix<double,_16,_1,_0,_16,_1>_>.m_storage.m_data.
                array + 8);
    pauVar4 = (undefined1 (*) [64])
              (Fg->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    auVar8 = vmulpd_avx512f(auVar10,auVar5);
    auVar9 = vmulpd_avx512f(auVar10,auVar6);
    auVar10 = vmulpd_avx512f(auVar10,auVar7);
    auVar5 = vmulpd_avx512f(auVar11,auVar5);
    auVar6 = vmulpd_avx512f(auVar11,auVar6);
    auVar11 = vmulpd_avx512f(auVar11,auVar7);
    vpermt2pd_avx512f(_DAT_009b4c00,auVar8);
    vpermi2pd_avx512f(_DAT_009b4c00,auVar11,auVar5);
    vpermt2pd_avx512f(_DAT_009b4b80,auVar9);
    vpermi2pd_avx512f(_DAT_009b4b80,auVar5,auVar6);
    auVar7 = vpermt2pd_avx512f(_DAT_009b4c40,auVar9);
    vpermt2pd_avx512f(_DAT_009b4c80,auVar10);
    auVar6 = vpermt2pd_avx512f(_DAT_009b4c40,auVar6);
    vpermt2pd_avx512f(_DAT_009b4c80,auVar11);
    auVar10 = vpermt2pd_avx512f(_DAT_009b4bc0,auVar10);
    auVar11 = vpermt2pd_avx512f(_DAT_009b4bc0,auVar11);
    auVar8 = vpermt2pd_avx512f(_DAT_009b4cc0,auVar8);
    auVar5 = vpermt2pd_avx512f(_DAT_009b4cc0,auVar5);
    *pauVar4 = auVar10;
    pauVar4[1] = auVar7;
    pauVar4[2] = auVar8;
    pauVar4[3] = auVar11;
    pauVar4[4] = auVar6;
    pauVar4[5] = auVar5;
    return;
  }
  __assert_fail("Fg.size() == 3 * NSF",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChElementShellANCF_3443.cpp"
                ,0x1f0,
                "virtual void chrono::fea::ChElementShellANCF_3443::ComputeGravityForces(ChVectorDynamic<> &, const ChVector<> &)"
               );
}

Assistant:

void ChElementShellANCF_3443::ComputeGravityForces(ChVectorDynamic<>& Fg, const ChVector<>& G_acc) {
    assert(Fg.size() == 3 * NSF);

    // Calculate and add the generalized force due to gravity to the generalized internal force vector for the element.
    // The generalized force due to gravity could be computed once prior to the start of the simulation if gravity was
    // assumed constant throughout the entire simulation.  However, this implementation assumes that the acceleration
    // due to gravity, while a constant for the entire system, can change from step to step which could be useful for
    // gravity loaded units tests as an example.  The generalized force due to gravity is calculated in compact matrix
    // form and is pre-mapped to the desired vector format
    Eigen::Map<MatrixNx3> GravForceCompact(Fg.data(), NSF, 3);
    GravForceCompact = m_GravForceScale * G_acc.eigen().transpose();
}